

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall ExprTest_EqualPLTerm_Test::TestBody(ExprTest_EqualPLTerm_Test *this)

{
  ExprFactory *this_00;
  internal iVar1;
  bool bVar2;
  Reference arg;
  PLTerm e1;
  PLTerm PVar3;
  NumericConstant e2;
  char *in_R9;
  AssertionResult gtest_ar__3;
  double breaks2 [2];
  double breaks [2];
  double slopes [3];
  AssertHelper local_b0;
  Message local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  double local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_90;
  AssertHelper local_88;
  string local_80;
  ExprBase local_60;
  double local_58 [5];
  
  local_58[0] = 5.0;
  local_58[1] = 10.0;
  local_58[2] = -1.0;
  local_58[3] = 0.0;
  local_58[4] = 1.0;
  this_00 = &(this->super_ExprTest).factory_;
  arg = mp::BasicExprFactory<std::allocator<char>_>::MakeReference(this_00,FIRST_REFERENCE,0);
  local_60.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeReference(this_00,FIRST_REFERENCE,1)
  ;
  e1 = ExprTest::MakePLTerm(&this->super_ExprTest,2,local_58,local_58 + 2,arg);
  PVar3 = ExprTest::MakePLTerm(&this->super_ExprTest,2,local_58,local_58 + 2,arg);
  iVar1 = (internal)
          mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar3.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  sStack_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98._0_1_ = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&local_98,
               (AssertionResult *)"Equal(e, MakePLTerm(2, breaks, slopes, x))","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2fc
               ,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  PVar3 = ExprTest::MakePLTerm(&this->super_ExprTest,1,local_58,local_58 + 2,arg);
  bVar2 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar3.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  local_98._0_1_ = (internal)!bVar2;
  sStack_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98._0_1_) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&local_98,
               (AssertionResult *)"Equal(e, MakePLTerm(1, breaks, slopes, x))","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2fd
               ,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  PVar3 = ExprTest::MakePLTerm
                    (&this->super_ExprTest,2,local_58,local_58 + 2,(Reference)local_60.impl_);
  bVar2 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar3.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  local_98 = (double)CONCAT71(local_98._1_7_,!bVar2);
  sStack_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&local_98,
               (AssertionResult *)"Equal(e, MakePLTerm(2, breaks, slopes, y))","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x2fe
               ,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_a8.ss_.ptr_._1_7_,local_a8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98 = 5.0;
  sStack_90.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4026000000000000;
  PVar3 = ExprTest::MakePLTerm(&this->super_ExprTest,2,&local_98,local_58 + 2,arg);
  bVar2 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)PVar3.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                          super_ExprBase.impl_);
  local_a8.ss_.ptr_._0_1_ = (internal)!bVar2;
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a8.ss_.ptr_._0_1_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&local_a8,
               (AssertionResult *)"Equal(e, MakePLTerm(2, breaks2, slopes, x))","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x300
               ,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  e2 = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,42.0);
  bVar2 = mp::Equal((Expr)e1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_,
                    (Expr)e2.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                          impl_);
  local_a8.ss_.ptr_._0_1_ = (internal)!bVar2;
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a8.ss_.ptr_._0_1_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&local_a8,(AssertionResult *)"Equal(e, MakeConst(42))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x301
               ,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, EqualPLTerm) {
  double breaks[] = {5, 10};
  double slopes[] = {-1, 0, 1};
  mp::Reference x = MakeVariable(0), y = MakeVariable(1);
  NumericExpr e = MakePLTerm(2, breaks, slopes, x);
  EXPECT_TRUE(Equal(e, MakePLTerm(2, breaks, slopes, x)));
  EXPECT_FALSE(Equal(e, MakePLTerm(1, breaks, slopes, x)));
  EXPECT_FALSE(Equal(e, MakePLTerm(2, breaks, slopes, y)));
  double breaks2[] = {5, 11};
  EXPECT_FALSE(Equal(e, MakePLTerm(2, breaks2, slopes, x)));
  EXPECT_FALSE(Equal(e, MakeConst(42)));
}